

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMapFromNativeOffset
          (FunctionBody *this,DWORD_PTR codeAddress,uint32 offset,StatementData *data,uint loopNum,
          FunctionBody *inlinee)

{
  int statementIndex_00;
  BOOL BVar1;
  undefined8 local_60;
  int statementIndex;
  SmallSpanSequence *spanSequence;
  EntryPointInfo *entryPoint;
  FunctionBody *inlinee_local;
  uint loopNum_local;
  StatementData *data_local;
  uint32 offset_local;
  DWORD_PTR codeAddress_local;
  FunctionBody *this_local;
  
  if (loopNum == 0xffffffff) {
    spanSequence = (SmallSpanSequence *)GetEntryPointFromNativeAddress(this,codeAddress);
  }
  else {
    spanSequence = (SmallSpanSequence *)
                   GetLoopEntryPointInfoFromNativeAddress(this,codeAddress,loopNum);
  }
  if (spanSequence == (SmallSpanSequence *)0x0) {
    local_60 = (SmallSpanSequence *)0x0;
  }
  else {
    local_60 = EntryPointInfo::GetNativeThrowSpanSequence((EntryPointInfo *)spanSequence);
  }
  statementIndex_00 = GetStatementIndexFromNativeOffset(this,local_60,offset);
  BVar1 = GetMatchingStatementMap(this,data,statementIndex_00,inlinee);
  return BVar1;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMapFromNativeOffset(DWORD_PTR codeAddress, uint32 offset, StatementData &data, uint loopNum, FunctionBody *inlinee /* = nullptr */)
    {
        EntryPointInfo * entryPoint;

        if (loopNum == -1)
        {
            entryPoint = GetEntryPointFromNativeAddress(codeAddress);
        }
        else
        {
            entryPoint = GetLoopEntryPointInfoFromNativeAddress(codeAddress, loopNum);
        }

        SmallSpanSequence *spanSequence = entryPoint ? entryPoint->GetNativeThrowSpanSequence() : nullptr;
        int statementIndex = GetStatementIndexFromNativeOffset(spanSequence, offset);

        return GetMatchingStatementMap(data, statementIndex, inlinee);
    }